

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::nativeSetMulticastInterface
          (QNativeSocketEnginePrivate *this,QNetworkInterface *iface)

{
  bool bVar1;
  int iVar2;
  NetworkLayerProtocol NVar3;
  quint32 __hostlong;
  char *pcVar4;
  QNetworkAddressEntry *this_00;
  qsizetype qVar5;
  int in_EDX;
  QNetworkInterface *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int r;
  QHostAddress *ip;
  QNetworkAddressEntry *entry;
  int i;
  QList<QNetworkAddressEntry> entries;
  in_addr v;
  uint v_1;
  qsizetype in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QNetworkInterface *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QHostAddress *this_01;
  int local_4c;
  byte local_31;
  QHostAddress local_30;
  QList<QNetworkAddressEntry> local_28;
  uint32_t local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RDI + 0xa0) == 1) || (*(int *)(in_RDI + 0xa0) == 2)) {
    pcVar4 = QNetworkInterface::index(in_RSI,(char *)in_RSI,in_EDX);
    local_c = SUB84(pcVar4,0);
    iVar2 = setsockopt((int)*(undefined8 *)(in_RDI + 0xd8),0x29,0x11,&local_c,4);
    local_31 = iVar2 != -1;
  }
  else {
    local_10 = 0xaaaaaaaa;
    bVar1 = QNetworkInterface::isValid
                      ((QNetworkInterface *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    if (bVar1) {
      local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_28.d.ptr = (QNetworkAddressEntry *)0xaaaaaaaaaaaaaaaa;
      local_28.d.size = -0x5555555555555556;
      QNetworkInterface::addressEntries(in_stack_ffffffffffffff88);
      local_4c = 0;
      while( true ) {
        this_00 = (QNetworkAddressEntry *)(long)local_4c;
        qVar5 = QList<QNetworkAddressEntry>::size(&local_28);
        if (qVar5 <= (long)this_00) break;
        QList<QNetworkAddressEntry>::at
                  ((QList<QNetworkAddressEntry> *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        QNetworkAddressEntry::ip(this_00);
        this_01 = &local_30;
        NVar3 = QHostAddress::protocol((QHostAddress *)0x35b532);
        if (NVar3 == IPv4Protocol) {
          __hostlong = QHostAddress::toIPv4Address
                                 (this_01,(bool *)CONCAT44(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98));
          local_10 = htonl(__hostlong);
          in_stack_ffffffffffffff9c =
               setsockopt((int)*(undefined8 *)(in_RDI + 0xd8),0,0x20,&local_10,4);
          if (in_stack_ffffffffffffff9c == -1) goto LAB_0035b593;
          local_31 = 1;
          iVar2 = 1;
        }
        else {
LAB_0035b593:
          iVar2 = 0;
        }
        QHostAddress::~QHostAddress((QHostAddress *)0x35b5a5);
        if (iVar2 != 0) goto LAB_0035b5ce;
        local_4c = local_4c + 1;
        in_stack_ffffffffffffff98 = 0;
      }
      local_31 = 0;
LAB_0035b5ce:
      QList<QNetworkAddressEntry>::~QList((QList<QNetworkAddressEntry> *)0x35b5d8);
    }
    else {
      local_10 = 0;
      iVar2 = setsockopt((int)*(undefined8 *)(in_RDI + 0xd8),0,0x20,&local_10,4);
      local_31 = iVar2 != -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool QNativeSocketEnginePrivate::nativeSetMulticastInterface(const QNetworkInterface &iface)
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v = iface.index();
        return (::setsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, sizeof(v)) != -1);
    }

    struct in_addr v;
    if (iface.isValid()) {
        QList<QNetworkAddressEntry> entries = iface.addressEntries();
        for (int i = 0; i < entries.size(); ++i) {
            const QNetworkAddressEntry &entry = entries.at(i);
            const QHostAddress &ip = entry.ip();
            if (ip.protocol() == QAbstractSocket::IPv4Protocol) {
                v.s_addr = htonl(ip.toIPv4Address());
                int r = ::setsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, sizeof(v));
                if (r != -1)
                    return true;
            }
        }
        return false;
    }

    v.s_addr = INADDR_ANY;
    return (::setsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, sizeof(v)) != -1);
}